

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testReadFromQuoteRequest(int count)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  QuoteReqID quoteReqID;
  Symbol symbol;
  NoRelatedSym group;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  Currency currency;
  MaturityMonthYear maturityMonthYear;
  NoRelatedSym noRelatedSym;
  OrdType ordType;
  OrderQty orderQty;
  Side side;
  QuoteRequest message;
  undefined1 local_588 [16];
  _Alloc_hider local_578 [2];
  char local_568 [16];
  _Alloc_hider local_558;
  size_type local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  field_metrics local_538;
  ulong local_530;
  _Alloc_hider *local_528;
  long local_520;
  FieldBase local_518;
  undefined1 local_4c0 [16];
  _Alloc_hider local_4b0;
  char local_4a0 [16];
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  field_metrics local_470;
  uint local_450;
  FieldBase local_448;
  FieldBase local_3f0;
  FieldBase local_398;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  QuoteRequest local_188;
  
  local_588._0_8_ = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"1","");
  local_4c0._0_8_ = &PTR__FieldBase_0011c4d8;
  local_4c0._8_4_ = 0x83;
  local_4b0._M_p = local_4a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b0,local_588._0_8_,
             (long)(pointer *)local_588._0_8_ + CONCAT44(local_588._12_4_,local_588._8_4_));
  local_490._M_p = (pointer)&local_480;
  local_488 = 0;
  local_480._M_local_buf[0] = '\0';
  local_470.m_length = 0;
  local_470.m_checksum = 0;
  local_4c0._0_8_ = &PTR__FieldBase_0011c8d8;
  FIX42::QuoteRequest::QuoteRequest(&local_188,(QuoteReqID *)local_4c0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_4c0);
  if ((_Alloc_hider *)local_588._0_8_ != local_578) {
    operator_delete((void *)local_588._0_8_,(ulong)(local_578[0]._M_p + 1));
  }
  FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)local_4c0);
  psVar2 = &local_518.m_string;
  iVar5 = 10;
  do {
    local_518._vptr_FieldBase = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"IBM","");
    local_588._0_8_ = &PTR__FieldBase_0011c4d8;
    local_588._8_4_ = 0x37;
    local_578[0]._M_p = local_568;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_578,local_518._vptr_FieldBase,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_518._vptr_FieldBase)->_M_p + local_518._8_8_));
    local_558._M_p = (pointer)&local_548;
    local_550 = 0;
    local_548._M_local_buf[0] = '\0';
    local_538.m_length = 0;
    local_538.m_checksum = 0;
    local_588._0_8_ = &PTR__FieldBase_0011c600;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    if ((string *)local_518._vptr_FieldBase != psVar2) {
      operator_delete(local_518._vptr_FieldBase,(ulong)(local_518.m_string._M_dataplus._M_p + 1));
    }
    FIX::StringField::StringField((StringField *)local_588,200);
    local_588._0_8_ = &PTR__FieldBase_0011c750;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    FIX::IntField::IntField((IntField *)local_588,0xc9,0);
    local_588._0_8_ = &PTR__FieldBase_0011c788;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    FIX::DoubleField::DoubleField((DoubleField *)local_588,0xca,120.0,0);
    local_588._0_8_ = &PTR__FieldBase_0011c7f8;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    FIX::CharField::CharField((CharField *)local_588,0x36,'1');
    local_588._0_8_ = &PTR__FieldBase_0011c638;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    FIX::DoubleField::DoubleField((DoubleField *)local_588,0x26,100.0,0);
    local_588._0_8_ = &PTR__FieldBase_0011c868;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    local_518._vptr_FieldBase = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"USD","");
    local_588._0_8_ = &PTR__FieldBase_0011c4d8;
    local_588._8_4_ = 0xf;
    local_578[0]._M_p = local_568;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_578,local_518._vptr_FieldBase,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_518._vptr_FieldBase)->_M_p + local_518._8_8_));
    local_558._M_p = (pointer)&local_548;
    local_550 = 0;
    local_548._M_local_buf[0] = '\0';
    local_538.m_length = 0;
    local_538.m_checksum = 0;
    local_588._0_8_ = &PTR__FieldBase_0011c8a0;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    if ((string *)local_518._vptr_FieldBase != psVar2) {
      operator_delete(local_518._vptr_FieldBase,(ulong)(local_518.m_string._M_dataplus._M_p + 1));
    }
    FIX::CharField::CharField((CharField *)local_588,0x28,'1');
    local_588._0_8_ = &PTR__FieldBase_0011c6e0;
    FIX::FieldMap::setField((FieldMap *)local_4c0,(FieldBase *)local_588,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_588);
    FIX::FieldMap::addGroup
              ((int)&local_188,(FieldMap *)(ulong)local_450,SUB81((FieldMap *)local_4c0,0));
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  FIX::FieldMap::clear();
  local_530 = 0;
  gettimeofday((timeval *)local_588,(__timezone_ptr_t)0x0);
  local_528 = (_Alloc_hider *)local_588._0_8_;
  local_520 = CONCAT44(local_588._12_4_,local_588._8_4_);
  if (0 < count) {
    do {
      FIX::StringField::StringField((StringField *)local_588,0x83);
      local_588._0_8_ = &PTR__FieldBase_0011c8d8;
      FIX::StringField::StringField((StringField *)&local_518,0x37);
      local_518._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c600;
      FIX::StringField::StringField((StringField *)&local_340,200);
      local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c750;
      FIX::IntField::IntField((IntField *)&local_3f0,0xc9);
      local_3f0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c788;
      FIX::DoubleField::DoubleField((DoubleField *)&local_448,0xca);
      local_448._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c7f8;
      FIX::CharField::CharField((CharField *)&local_1e0,0x36);
      local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c638;
      FIX::DoubleField::DoubleField((DoubleField *)&local_238,0x26);
      local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c868;
      FIX::StringField::StringField((StringField *)&local_398,0xf);
      local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c8a0;
      FIX::CharField::CharField((CharField *)&local_290,0x28);
      local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6e0;
      FIX::IntField::IntField((IntField *)&local_2e8,0x92);
      local_2e8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c9b8;
      FIX::FieldMap::getField((FieldMap *)&local_188,&local_2e8);
      iVar5 = FIX::IntField::getValue((IntField *)&local_2e8);
      if (0 < iVar5) {
        uVar4 = 1;
        do {
          FIX::Message::getGroup((Message *)&local_188,uVar4,(Group *)local_4c0);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_518);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_340);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_3f0);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_448);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_1e0);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_238);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_398);
          FIX::FieldMap::getField((FieldMap *)local_4c0,&local_290);
          FIX::IntField::getValue((IntField *)&local_3f0);
          FIX::DoubleField::getValue((DoubleField *)&local_448);
          FIX::CharField::getValue((CharField *)&local_1e0);
          FIX::DoubleField::getValue((DoubleField *)&local_238);
          FIX::CharField::getValue((CharField *)&local_290);
          iVar1 = (1 - iVar5) + uVar4;
          uVar4 = uVar4 + 1;
        } while (iVar1 != 1);
      }
      FIX::FieldBase::~FieldBase(&local_2e8);
      FIX::FieldBase::~FieldBase(&local_290);
      FIX::FieldBase::~FieldBase(&local_398);
      FIX::FieldBase::~FieldBase(&local_238);
      FIX::FieldBase::~FieldBase(&local_1e0);
      FIX::FieldBase::~FieldBase(&local_448);
      FIX::FieldBase::~FieldBase(&local_3f0);
      FIX::FieldBase::~FieldBase(&local_340);
      FIX::FieldBase::~FieldBase(&local_518);
      FIX::FieldBase::~FieldBase((FieldBase *)local_588);
      uVar4 = (int)local_530 + 1;
      local_530 = (ulong)uVar4;
    } while (uVar4 != count);
  }
  lVar6 = local_520 + (long)((double)(long)local_528 * 1000000.0);
  gettimeofday((timeval *)local_588,(__timezone_ptr_t)0x0);
  dVar7 = (double)(long)local_588._0_8_;
  lVar3 = CONCAT44(local_588._12_4_,local_588._8_4_);
  FIX::FieldMap::~FieldMap((FieldMap *)local_4c0);
  FIX::Message::~Message((Message *)&local_188);
  return (lVar3 - lVar6) + (long)(dVar7 * 1000000.0);
}

Assistant:

long testReadFromQuoteRequest(int count) {
  count = count - 1;

  FIX42::QuoteRequest message(FIX::QuoteReqID("1"));
  FIX42::QuoteRequest::NoRelatedSym group;

  for (int i = 1; i <= 10; ++i) {
    group.set(FIX::Symbol("IBM"));
    group.set(FIX::MaturityMonthYear());
    group.set(FIX::PutOrCall(FIX::PutOrCall_PUT));
    group.set(FIX::StrikePrice(120));
    group.set(FIX::Side(FIX::Side_BUY));
    group.set(FIX::OrderQty(100));
    group.set(FIX::Currency("USD"));
    group.set(FIX::OrdType(FIX::OrdType_MARKET));
    message.addGroup(group);
  }
  group.clear();

  long start = GetTickCount();
  for (int j = 0; j <= count; ++j) {
    FIX::QuoteReqID quoteReqID;
    FIX::Symbol symbol;
    FIX::MaturityMonthYear maturityMonthYear;
    FIX::PutOrCall putOrCall;
    FIX::StrikePrice strikePrice;
    FIX::Side side;
    FIX::OrderQty orderQty;
    FIX::Currency currency;
    FIX::OrdType ordType;

    FIX::NoRelatedSym noRelatedSym;
    message.get(noRelatedSym);
    int end = noRelatedSym;
    for (int k = 1; k <= end; ++k) {
      message.getGroup(k, group);
      group.get(symbol);
      group.get(maturityMonthYear);
      group.get(putOrCall);
      group.get(strikePrice);
      group.get(side);
      group.get(orderQty);
      group.get(currency);
      group.get(ordType);
      maturityMonthYear.getValue();
      putOrCall.getValue();
      strikePrice.getValue();
      side.getValue();
      orderQty.getValue();
      currency.getValue();
      ordType.getValue();
    }
  }

  return GetTickCount() - start;
}